

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall
ImDrawList::AddCircle
          (ImDrawList *this,ImVec2 *center,float radius,ImU32 col,int num_segments,float thickness)

{
  float fVar1;
  float a_max;
  int radius_idx;
  float thickness_local;
  int num_segments_local;
  ImU32 col_local;
  float radius_local;
  ImVec2 *center_local;
  ImDrawList *this_local;
  
  if (((col & 0xff000000) != 0) && (0.0 < radius)) {
    if (num_segments < 1) {
      if ((int)radius + -1 < 0x40) {
        radius_idx = (int)this->_Data->CircleSegmentCounts[(int)radius + -1];
      }
      else {
        fVar1 = acosf((radius - this->_Data->CircleSegmentMaxError) / radius);
        radius_idx = ImClamp<int>((int)(6.2831855 / fVar1),0xc,0x200);
      }
    }
    else {
      radius_idx = ImClamp<int>(num_segments,3,0x200);
    }
    if (radius_idx == 0xc) {
      PathArcToFast(this,center,radius - 0.5,0,0xc);
    }
    else {
      PathArcTo(this,center,radius - 0.5,0.0,
                (((float)radius_idx - 1.0) * 6.2831855) / (float)radius_idx,radius_idx + -1);
    }
    PathStroke(this,col,true,thickness);
  }
  return;
}

Assistant:

void ImDrawList::AddCircle(const ImVec2& center, float radius, ImU32 col, int num_segments, float thickness)
{
    if ((col & IM_COL32_A_MASK) == 0 || radius <= 0.0f)
        return;

    // Obtain segment count
    if (num_segments <= 0)
    {
        // Automatic segment count
        const int radius_idx = (int)radius - 1;
        if (radius_idx < IM_ARRAYSIZE(_Data->CircleSegmentCounts))
            num_segments = _Data->CircleSegmentCounts[radius_idx]; // Use cached value
        else
            num_segments = IM_DRAWLIST_CIRCLE_AUTO_SEGMENT_CALC(radius, _Data->CircleSegmentMaxError);
    }
    else
    {
        // Explicit segment count (still clamp to avoid drawing insanely tessellated shapes)
        num_segments = ImClamp(num_segments, 3, IM_DRAWLIST_CIRCLE_AUTO_SEGMENT_MAX);
    }

    // Because we are filling a closed shape we remove 1 from the count of segments/points
    const float a_max = (IM_PI * 2.0f) * ((float)num_segments - 1.0f) / (float)num_segments;
    if (num_segments == 12)
        PathArcToFast(center, radius - 0.5f, 0, 12);
    else
        PathArcTo(center, radius - 0.5f, 0.0f, a_max, num_segments - 1);
    PathStroke(col, true, thickness);
}